

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  reference ppCVar4;
  const_reference ppCVar5;
  long *in_RSI;
  long *in_RDI;
  size_t i;
  size_type in_stack_ffffffffffffffb8;
  value_type in_stack_ffffffffffffffc0;
  ulong local_20;
  bool local_1;
  
  lVar1 = (**(code **)(*in_RDI + 0x50))();
  lVar2 = (**(code **)(*in_RSI + 0x50))();
  if (lVar1 == lVar2) {
    for (local_20 = 0;
        sVar3 = ::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::size
                          ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                           (in_RDI + 2)), local_20 < sVar3; local_20 = local_20 + 1) {
      ppCVar4 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::at
                          ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = *ppCVar4;
      ppCVar5 = std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::at
                          ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (in_stack_ffffffffffffffc0 != *ppCVar5) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }